

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O2

void __thiscall glslang::TIntermSelection::traverse(TIntermSelection *this,TIntermTraverser *it)

{
  pointer *pppTVar1;
  TIntermNode *pTVar2;
  int iVar3;
  TIntermTyped *pTVar4;
  
  if ((it->preVisit == true) &&
     (iVar3 = (*it->_vptr_TIntermTraverser[6])(it,0,this), (char)iVar3 == '\0')) {
    return;
  }
  TIntermTraverser::incrementDepth(it,(TIntermNode *)this);
  if (it->rightToLeft == true) {
    pTVar2 = this->falseBlock;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
    }
    pTVar2 = this->trueBlock;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
    }
    pTVar4 = this->condition;
  }
  else {
    (*(this->condition->super_TIntermNode)._vptr_TIntermNode[2])(this->condition,it);
    pTVar2 = this->trueBlock;
    if (pTVar2 != (TIntermNode *)0x0) {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,it);
    }
    pTVar4 = (TIntermTyped *)this->falseBlock;
    if (pTVar4 == (TIntermTyped *)0x0) goto LAB_004003f9;
  }
  (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[2])(pTVar4,it);
LAB_004003f9:
  it->depth = it->depth + -1;
  pppTVar1 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppTVar1 = *pppTVar1 + -1;
  if (it->postVisit != true) {
    return;
  }
  (*it->_vptr_TIntermTraverser[6])(it,2,this);
  return;
}

Assistant:

void TIntermSelection::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitSelection(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);
        if (it->rightToLeft) {
            if (falseBlock)
                falseBlock->traverse(it);
            if (trueBlock)
                trueBlock->traverse(it);
            condition->traverse(it);
        } else {
            condition->traverse(it);
            if (trueBlock)
                trueBlock->traverse(it);
            if (falseBlock)
                falseBlock->traverse(it);
        }
        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitSelection(EvPostVisit, this);
}